

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_reporting.hpp
# Opt level: O3

string * __thiscall
pstore::http::build_headers<std::pair<char_const*,char_const*>const*,void>
          (string *__return_storage_ptr__,http *this,pair<const_char_*,_const_char_*> *first,
          pair<const_char_*,_const_char_*> *last)

{
  ostringstream os;
  anon_class_8_1_3fcf66a2 local_1a0;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  local_1a0.os = (ostringstream *)local_198;
  if ((pair<const_char_*,_const_char_*> *)this != first) {
    do {
      build_headers<const_std::pair<const_char_*,_const_char_*>_*,_void>::anon_class_8_1_3fcf66a2::
      operator()(&local_1a0,(czstring_pair *)this);
      this = (http *)((long)this + 0x10);
    } while ((pair<const_char_*,_const_char_*> *)this != first);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"Server: ",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"pstore-http",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\r\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\r\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string build_headers (InputIterator first, InputIterator last) {
            std::ostringstream os;
            std::for_each (first, last, [&] (czstring_pair const & p) {
                os << p.first << ": " << p.second << crlf;
            });
            os << "Server: " << server_name << crlf;
            os << crlf;
            return os.str ();
        }